

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O1

void __thiscall AVSInterface::AVSWrapper<MiniDeen>::Initialize(AVSWrapper<MiniDeen> *this)

{
  PClip *pPVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  AVSValue *pAVar10;
  undefined4 extraout_var;
  AVSFetchFrameFunctor *pAVar12;
  undefined4 extraout_var_00;
  code *pcVar14;
  long lVar15;
  undefined1 uVar16;
  long *plVar17;
  undefined8 *puVar18;
  undefined1 uVar19;
  AVSValue *pAVar20;
  byte bVar21;
  initializer_list<Param> __l;
  AVSInDelegator argument;
  DSVideoInfo in_stack_fffffffffffffd28;
  undefined1 local_271;
  undefined2 local_270;
  undefined1 local_26e;
  undefined4 local_26c;
  undefined1 local_268;
  int local_264;
  int local_260;
  allocator_type local_259;
  undefined8 local_258;
  IScriptEnvironment *local_250;
  ulong local_248;
  ulong local_240;
  PClip local_238;
  undefined4 local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  undefined4 uStack_1f8;
  undefined4 local_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  AVSWrapper<MiniDeen> *local_1e0;
  AVSValue *local_1d8;
  vector<Param,_std::allocator<Param>_> local_1d0;
  AVSValue local_1b8;
  AVSInDelegator local_1a8;
  undefined1 local_158 [16];
  int local_148;
  int iStack_144;
  int iStack_140;
  undefined4 uStack_13c;
  ulong local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined2 local_83;
  undefined1 local_81;
  int local_80;
  undefined4 local_7c;
  undefined4 local_78;
  int local_74;
  int local_70;
  undefined4 local_6c;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  undefined8 *puVar11;
  undefined4 *puVar13;
  
  bVar21 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  local_1f4 = 0;
  uStack_1f0 = 0;
  uStack_1ec = 0;
  uStack_1e8 = 0;
  pAVar20 = &this->_args;
  pAVar10 = pAVar20;
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
    pcVar14 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
    plVar17 = (long *)((long)&pAVar20->type + *(long *)&AVS_linkage->field_0x510);
    if (((ulong)pcVar14 & 1) != 0) {
      pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
    }
    pAVar10 = (AVSValue *)(*pcVar14)(plVar17,0);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x528 < (uint)AVS_linkage->Size)) {
    pcVar14 = (code *)AVS_linkage->IsClip;
    plVar17 = (long *)((long)&pAVar10->type + *(long *)&AVS_linkage->field_0x530);
    if (((ulong)pcVar14 & 1) != 0) {
      pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
    }
    cVar7 = (*pcVar14)(plVar17);
    if (cVar7 != '\0') {
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
        pcVar14 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
        plVar17 = (long *)((long)&pAVar20->type + *(long *)&AVS_linkage->field_0x510);
        if (((ulong)pcVar14 & 1) != 0) {
          pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
        }
        (*pcVar14)(plVar17,0);
      }
      AVSValue::AsClip((AVSValue *)local_158);
      pPVar1 = &this->clip;
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x3c8 < (uint)AVS_linkage->Size)) {
        pcVar14 = (code *)AVS_linkage->PClip_OPERATOR_ASSIGN1;
        plVar17 = (long *)((long)&pPVar1->p + *(long *)&AVS_linkage->field_0x3d0);
        if (((ulong)pcVar14 & 1) != 0) {
          pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
        }
        (*pcVar14)(plVar17,local_158);
      }
      local_1e0 = this;
      local_1d8 = pAVar20;
      PClip::~PClip((PClip *)local_158);
      local_250 = (IScriptEnvironment *)pPVar1;
      iVar8 = (*pPVar1->p->_vptr_IClip[5])();
      puVar11 = (undefined8 *)CONCAT44(extraout_var,iVar8);
      local_258 = *puVar11;
      uVar2 = *(uint *)(puVar11 + 1);
      uVar3 = *(uint *)((long)puVar11 + 0xc);
      uVar4 = *(undefined4 *)(puVar11 + 2);
      uVar5 = *(undefined4 *)(puVar11 + 3);
      uVar6 = *(undefined4 *)((long)puVar11 + 0x1c);
      local_228 = puVar11[4];
      uStack_220 = puVar11[5];
      DSFormat::DSFormat((DSFormat *)local_158,*(int *)((long)puVar11 + 0x14));
      iVar8 = local_158._8_4_;
      uVar19 = local_158[4];
      uVar16 = local_158[2];
      local_218 = local_258;
      local_128 = local_258;
      local_110 = (undefined4)local_228;
      uStack_10c = (undefined4)((ulong)local_228 >> 0x20);
      uStack_108 = (undefined4)uStack_220;
      uStack_104 = (undefined4)((ulong)uStack_220 >> 0x20);
      local_271 = local_158[0];
      local_268 = local_158[1];
      local_258 = CONCAT71((int7)((ulong)local_258 >> 8),local_158[3]);
      local_270 = local_158._5_2_;
      local_26e = local_158[7];
      local_228 = CONCAT44(uStack_10c,local_148);
      local_260 = iStack_144;
      local_264 = iStack_140;
      uStack_210 = CONCAT44(uVar5,uVar4);
      uStack_1f8 = uStack_114;
      local_1f4 = local_110;
      uStack_1f0 = uStack_10c;
      uStack_1ec = uStack_108;
      uStack_1e8 = uStack_104;
      local_248 = (ulong)uVar2;
      local_240 = (ulong)uVar3;
      local_208 = uVar6;
      local_138 = (ulong)uVar2;
      uStack_130 = (ulong)uVar3;
      uStack_120 = uVar4;
      uStack_11c = uVar5;
      local_118 = uVar6;
      pAVar12 = (AVSFetchFrameFunctor *)operator_new(0x70);
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x398 < (uint)AVS_linkage->Size)) {
        pcVar14 = (code *)AVS_linkage->PClip_CONSTRUCTOR1;
        plVar17 = (long *)((long)&local_238.p + *(long *)&AVS_linkage->field_0x3a0);
        if (((ulong)pcVar14 & 1) != 0) {
          pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
        }
        (*pcVar14)(plVar17,local_250);
      }
      local_22c = uStack_13c;
      local_26c = local_158._12_4_;
      iVar9 = (*(*(IClip **)&local_250->field_0x0)->_vptr_IClip[5])();
      pAVar20 = local_1d8;
      this = local_1e0;
      puVar13 = (undefined4 *)CONCAT44(extraout_var_00,iVar9);
      uVar4 = *puVar13;
      uVar5 = puVar13[1];
      local_158._8_4_ = puVar13[2];
      local_158._12_4_ = puVar13[3];
      local_148 = puVar13[4];
      iStack_144 = puVar13[5];
      iStack_140 = puVar13[6];
      uStack_13c = puVar13[7];
      local_138 = *(ulong *)(puVar13 + 8);
      uStack_130 = *(ulong *)(puVar13 + 10);
      local_158[0] = SUB41(uVar4,0);
      local_158[1] = SUB41((uint)uVar4 >> 8,0);
      local_158[2] = SUB41((uint)uVar4 >> 0x10,0);
      local_158[3] = SUB41((uint)uVar4 >> 0x18,0);
      local_158[4] = SUB41(uVar5,0);
      local_158._5_2_ = (undefined2)((uint)uVar5 >> 8);
      local_158[7] = (undefined1)((uint)uVar5 >> 0x18);
      local_250 = local_1e0->_env;
      (pAVar12->super_FetchFrameFunctor)._vptr_FetchFrameFunctor =
           (_func_int **)&PTR_operator___00116b40;
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x398 < (uint)AVS_linkage->Size)) {
        pcVar14 = (code *)AVS_linkage->PClip_CONSTRUCTOR1;
        plVar17 = (long *)((long)&(pAVar12->_clip).p + *(long *)&AVS_linkage->field_0x3a0);
        if (((ulong)pcVar14 & 1) != 0) {
          pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
        }
        (*pcVar14)(plVar17,&local_238);
      }
      uVar4 = CONCAT13(local_158[3],CONCAT12(local_158[2],CONCAT11(local_158[1],local_158[0])));
      (pAVar12->_vi).num_audio_samples = local_138;
      (pAVar12->_vi).nchannels = (undefined4)uStack_130;
      (pAVar12->_vi).image_type = uStack_130._4_4_;
      (pAVar12->_vi).num_frames = local_148;
      (pAVar12->_vi).pixel_type = iStack_144;
      (pAVar12->_vi).audio_samples_per_second = iStack_140;
      (pAVar12->_vi).sample_type = uStack_13c;
      (pAVar12->_vi).width = uVar4;
      (pAVar12->_vi).height =
           (int)(CONCAT17(local_158[7],CONCAT25(local_158._5_2_,CONCAT14(local_158[4],uVar4))) >>
                0x20);
      (pAVar12->_vi).fps_numerator = local_158._8_4_;
      (pAVar12->_vi).fps_denominator = local_158._12_4_;
      pAVar12->_env = local_250;
      (pAVar12->fetch_frame_mutex).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(pAVar12->fetch_frame_mutex).super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(pAVar12->fetch_frame_mutex).super___mutex_base._M_mutex + 0x10) = 0;
      (pAVar12->fetch_frame_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (pAVar12->fetch_frame_mutex).super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      this->functor = pAVar12;
      PClip::~PClip(&local_238);
      goto LAB_0010e3ef;
    }
  }
  local_264 = 3;
  local_260 = 1;
  local_228 = CONCAT44(local_228._4_4_,8);
  local_258 = CONCAT71(local_258._1_7_,1);
  local_240 = 1;
  local_26c = 0;
  local_248 = 1;
  iVar8 = 0;
  uVar19 = 0;
  uVar16 = 0;
  local_268 = 0;
  local_271 = 1;
LAB_0010e3ef:
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x4d8 < (uint)AVS_linkage->Size)) {
    pcVar14 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
    plVar17 = (long *)((long)&local_1b8.type + *(long *)&AVS_linkage->field_0x4e0);
    if (((ulong)pcVar14 & 1) != 0) {
      pcVar14 = *(code **)(pcVar14 + *plVar17 + -1);
    }
    (*pcVar14)(plVar17,pAVar20);
  }
  memcpy((iterator)local_158,&PTR_anon_var_dwarf_3a3b_00116898,0xd0);
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_158;
  std::vector<Param,_std::allocator<Param>_>::vector(&local_1d0,__l,&local_259);
  AVSInDelegator::AVSInDelegator(&local_1a8,&local_1b8,&local_1d0);
  if (local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  AVSValue::~AVSValue(&local_1b8);
  local_88 = local_271;
  local_87 = local_268;
  local_86 = uVar16;
  local_85 = (undefined1)local_258;
  local_84 = uVar19;
  local_83 = local_270;
  local_81 = local_26e;
  local_80 = iVar8;
  local_7c = local_26c;
  local_78 = (undefined4)local_228;
  local_74 = local_260;
  local_70 = local_264;
  local_6c = local_22c;
  local_68 = local_248;
  local_60 = local_240;
  local_58 = local_218;
  uStack_50 = uStack_210;
  local_48 = local_208;
  local_34 = uStack_1e8;
  local_44 = CONCAT44(local_1f4,uStack_1f8);
  uStack_3c = CONCAT44(uStack_1ec,uStack_1f0);
  pAVar12 = this->functor;
  puVar11 = (undefined8 *)&local_88;
  puVar18 = (undefined8 *)&stack0xfffffffffffffd28;
  for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar18 = *puVar11;
    puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
  }
  MiniDeen::Initialize
            (&this->data,&local_1a8.super_InDelegator,in_stack_fffffffffffffd28,
             &pAVar12->super_FetchFrameFunctor);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a8._params_index_map._M_h);
  AVSValue::~AVSValue(&local_1a8._args);
  return;
}

Assistant:

void Initialize()
    {
      auto input_vi = DSVideoInfo();
      if (_args[0].IsClip()) {
        clip = _args[0].AsClip();
        input_vi = DSVideoInfo(clip->GetVideoInfo());
        functor = new AVSFetchFrameFunctor(clip, clip->GetVideoInfo(), _env);
      }
      auto argument = AVSInDelegator(_args, data.Params());
      data.Initialize(&argument, input_vi, functor);
    }